

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

int Abc_DesFindTopLevelModels(Abc_Des_t *p)

{
  void *pvVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  int iVar4;
  
  p_00 = p->vModules;
  iVar4 = p_00->nSize;
  if (0 < iVar4) {
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,iVar3);
      *(undefined4 *)((long)pvVar1 + 0xc0) = 0;
      p_00 = p->vModules;
      iVar4 = p_00->nSize;
    }
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p_00,iVar3);
      for (iVar4 = 0; iVar4 < pNtk->vBoxes->nSize; iVar4 = iVar4 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,iVar4);
        if (((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) && ((pAVar2->field_5).pData != (void *)0x0))
        {
          *(undefined4 *)((long)(pAVar2->field_5).pData + 0xc0) = 1;
        }
      }
      p_00 = p->vModules;
      iVar4 = p_00->nSize;
    }
    p->vTops->nSize = 0;
    for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,iVar4);
      if (*(int *)((long)pvVar1 + 0xc0) == 0) {
        Vec_PtrPush(p->vTops,pvVar1);
      }
      else {
        *(undefined4 *)((long)pvVar1 + 0xc0) = 0;
      }
      p_00 = p->vModules;
    }
    return p->vTops->nSize;
  }
  __assert_fail("Vec_PtrSize( p->vModules ) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                ,0x12a,"int Abc_DesFindTopLevelModels(Abc_Des_t *)");
}

Assistant:

int Abc_DesFindTopLevelModels( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Vec_PtrSize( p->vModules ) > 0 );
    // clear the models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    // mark all the models reachable from other models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        Abc_NtkForEachBox( pNtk, pObj, k )
        {
            if ( Abc_ObjIsLatch(pObj) )
                continue;
            if ( pObj->pData == NULL )
                continue;
            pNtkBox = (Abc_Ntk_t *)pObj->pData;
            pNtkBox->fHieVisited = 1;
        }
    }
    // collect the models that are not marked
    Vec_PtrClear( p->vTops );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        if ( pNtk->fHieVisited == 0 )
            Vec_PtrPush( p->vTops, pNtk );
        else
            pNtk->fHieVisited = 0;
    }
    return Vec_PtrSize( p->vTops );
}